

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O2

void print_GeneralInformation(ClassFile *classFile)

{
  ushort uVar1;
  u2 uVar2;
  FILE *pFVar3;
  char *pcVar4;
  
  fprintf((FILE *)out,"\t Minor Version: \t\t %hu\n",(ulong)classFile->minor_version);
  pFVar3 = out;
  uVar1 = classFile->major_version;
  Utils::generateFriendlyVersionNumber(classFile);
  fprintf((FILE *)pFVar3,"\t Major Version: \t\t %hu [%.1f]\n",(ulong)uVar1);
  fprintf((FILE *)out,"\t Constant pool count: \t\t %hu\n",(ulong)classFile->constant_pool_count);
  pFVar3 = out;
  uVar2 = classFile->access_flags;
  pcVar4 = getAccessFlags(uVar2);
  fprintf((FILE *)pFVar3,"\t Access Flags: \t\t\t 0x%.4X [%s]\n",(ulong)uVar2,pcVar4);
  pFVar3 = out;
  uVar2 = classFile->this_class;
  pcVar4 = getFormattedConstant(classFile->constant_pool,uVar2);
  fprintf((FILE *)pFVar3,"\t This class: \t\t\t cp_info #%hu <%s>\n",(ulong)uVar2,pcVar4);
  pFVar3 = out;
  uVar2 = classFile->super_class;
  if (uVar2 == 0) {
    fwrite("\t Super class: \t\t\t none\n",0x18,1,(FILE *)out);
  }
  else {
    pcVar4 = getFormattedConstant(classFile->constant_pool,uVar2);
    fprintf((FILE *)pFVar3,"\t Super class: \t\t\t cp_info #%hu <%s>\n",(ulong)uVar2,pcVar4);
  }
  fprintf((FILE *)out,"\t Interfaces count: \t\t %hu\n",(ulong)classFile->interfaces_count);
  fprintf((FILE *)out,"\t Fields count: \t\t\t %hu\n",(ulong)classFile->fields_count);
  fprintf((FILE *)out,"\t Methods pool count: \t\t %hu\n",(ulong)classFile->methods_count);
  fprintf((FILE *)out,"\t Attributes pool count: \t %hu\n",(ulong)classFile->attributes_count);
  return;
}

Assistant:

void print_GeneralInformation (ClassFile *classFile) {
    
    fprintf(out,"\t Minor Version: \t\t %hu\n", classFile->minor_version);
    fprintf(out,"\t Major Version: \t\t %hu [%.1f]\n", classFile->major_version, Utils::generateFriendlyVersionNumber(classFile));
    fprintf(out,"\t Constant pool count: \t\t %hu\n", classFile->constant_pool_count);
    fprintf(out,"\t Access Flags: \t\t\t 0x%.4X [%s]\n", classFile->access_flags, getAccessFlags(classFile->access_flags));
    fprintf(out,"\t This class: \t\t\t cp_info #%hu <%s>\n", classFile->this_class, getFormattedConstant(classFile->constant_pool, classFile->this_class));
    
    if (classFile->super_class == 0) {
        fprintf(out,"\t Super class: \t\t\t none\n");
    } else {
        fprintf(out,"\t Super class: \t\t\t cp_info #%hu <%s>\n", classFile->super_class, getFormattedConstant(classFile->constant_pool, classFile->super_class));
    }
    
    fprintf(out,"\t Interfaces count: \t\t %hu\n", classFile->interfaces_count);
    fprintf(out,"\t Fields count: \t\t\t %hu\n", classFile->fields_count);
    fprintf(out,"\t Methods pool count: \t\t %hu\n", classFile->methods_count);
    fprintf(out,"\t Attributes pool count: \t %hu\n", classFile->attributes_count);
}